

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

JavascriptProxy * Js::JavascriptProxy::UnwrapNestedProxies(JavascriptProxy *proxy)

{
  bool bVar1;
  RecyclableObject **ppRVar2;
  JavascriptProxy *local_30;
  Type local_20;
  JavascriptProxy *nestedProxy;
  JavascriptProxy *proxy_local;
  
  nestedProxy = proxy;
  while( true ) {
    bVar1 = IsRevoked(nestedProxy);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return nestedProxy;
    }
    ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                        ((WriteBarrierPtr *)&nestedProxy->target);
    Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierPtr
              ((WriteBarrierPtr<Js::RecyclableObject> *)&stack0xffffffffffffffd8,*ppRVar2);
    proxy_local = (JavascriptProxy *)&stack0xffffffffffffffd8;
    ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                        ((WriteBarrierPtr *)&stack0xffffffffffffffd8);
    bVar1 = VarIs<Js::JavascriptProxy>(*ppRVar2);
    if (bVar1) {
      ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                          ((WriteBarrierPtr *)&stack0xffffffffffffffd8);
      local_30 = UnsafeVarTo<Js::JavascriptProxy>(*ppRVar2);
    }
    else {
      local_30 = (JavascriptProxy *)0x0;
    }
    local_20.ptr = (Type *)local_30;
    if (local_30 == (JavascriptProxy *)0x0) break;
    nestedProxy = local_30;
  }
  return nestedProxy;
}

Assistant:

const JavascriptProxy* JavascriptProxy::UnwrapNestedProxies(const JavascriptProxy* proxy)
    {
        // continue while we have a proxy that is not revoked
        while (!proxy->IsRevoked())
        {
            JavascriptProxy* nestedProxy = JavascriptOperators::TryFromVar<JavascriptProxy>(proxy->target);
            if (nestedProxy == nullptr)
            {
                break;
            }

            proxy = nestedProxy;
        }

        return proxy;
    }